

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O1

IteratedExpr __thiscall ExprVisitorTest::MakeIterated(ExprVisitorTest *this,Kind kind)

{
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  BVar1;
  IteratedExprBuilder IVar2;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
  builder;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
  local_28;
  
  IVar2 = mp::BasicExprFactory<std::allocator<char>_>::BeginIterated(&this->factory_,kind,1);
  local_28.impl_ = IVar2.impl_;
  local_28.arg_index_ = IVar2.arg_index_;
  mp::BasicExprFactory<std::allocator<char>_>::
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
  ::AddArg(&local_28,
           (Arg)(this->var_).super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.
                impl_);
  builder.arg_index_ = local_28.arg_index_;
  builder.impl_ = local_28.impl_;
  builder._12_4_ = 0;
  BVar1 = mp::BasicExprFactory<std::allocator<char>>::
          EndIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
                    ((BasicExprFactory<std::allocator<char>> *)&this->factory_,builder);
  return (IteratedExpr)
         BVar1.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_;
}

Assistant:

mp::IteratedExpr MakeIterated(expr::Kind kind) {
    auto builder = factory_.BeginIterated(kind, 1);
    builder.AddArg(var_);
    return factory_.EndIterated(builder);
  }